

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void __thiscall llvm::yaml::Output::flowKey(Output *this,StringRef Key)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  
  uVar2 = (ulong)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                 super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                 super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                 super_SmallVectorBase.Size;
  if (uVar2 != 0) {
    if (*(int *)((long)(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
                       super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                       super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                       super_SmallVectorBase.BeginX + uVar2 * 4 + -4) == 7) {
      this->Column = this->Column + 2;
      Str.Length = 2;
      Str.Data = ", ";
      raw_ostream::operator<<(this->Out,Str);
    }
    if ((this->WrapColumn != 0) && (this->WrapColumn < this->Column)) {
      this->Column = this->Column + 1;
      Str_00.Length = 1;
      Str_00.Data = "\n";
      raw_ostream::operator<<(this->Out,Str_00);
      iVar1 = this->ColumnAtMapFlowStart;
      if (0 < iVar1) {
        iVar3 = 0;
        do {
          this->Column = this->Column + 1;
          Str_01.Length = 1;
          Str_01.Data = " ";
          raw_ostream::operator<<(this->Out,Str_01);
          iVar3 = iVar3 + 1;
          iVar1 = this->ColumnAtMapFlowStart;
        } while (iVar3 < iVar1);
      }
      this->Column = iVar1 + 2;
      Str_02.Length = 2;
      Str_02.Data = "  ";
      raw_ostream::operator<<(this->Out,Str_02);
    }
    this->Column = this->Column + (int)Key.Length;
    raw_ostream::operator<<(this->Out,Key);
    this->Column = this->Column + 2;
    Str_03.Length = 2;
    Str_03.Data = ": ";
    raw_ostream::operator<<(this->Out,Str_03);
    return;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0xa7,
                "reference llvm::SmallVectorTemplateCommon<llvm::yaml::Output::InState>::back() [T = llvm::yaml::Output::InState]"
               );
}

Assistant:

void Output::flowKey(StringRef Key) {
  if (StateStack.back() == inFlowMapOtherKey)
    output(", ");
  if (WrapColumn && Column > WrapColumn) {
    output("\n");
    for (int I = 0; I < ColumnAtMapFlowStart; ++I)
      output(" ");
    Column = ColumnAtMapFlowStart;
    output("  ");
  }
  output(Key);
  output(": ");
}